

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pstd.h
# Opt level: O0

void __thiscall
pstd::pmr::polymorphic_allocator<std::byte>::
construct<pbrt::TriangleMesh,pbrt::Transform_const&,bool&,std::vector<int,std::allocator<int>>&,std::vector<pbrt::Point3<float>,std::allocator<pbrt::Point3<float>>>&,std::vector<pbrt::Vector3<float>,std::allocator<pbrt::Vector3<float>>>,std::vector<pbrt::Normal3<float>,std::allocator<pbrt::Normal3<float>>>&,std::vector<pbrt::Point2<float>,std::allocator<pbrt::Point2<float>>>,std::vector<int,std::allocator<int>>>
          (polymorphic_allocator<std::byte> *this,TriangleMesh *p,Transform *args,bool *args_1,
          vector<int,_std::allocator<int>_> *args_2,
          vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_> *args_3,
          vector<pbrt::Vector3<float>,_std::allocator<pbrt::Vector3<float>_>_> *args_4,
          vector<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_> *args_5,
          vector<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_> *args_6,
          vector<int,_std::allocator<int>_> *args_7)

{
  vector<pbrt::Vector3<float>,_std::allocator<pbrt::Vector3<float>_>_> *in_stack_00000090;
  vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_> *in_stack_00000098;
  vector<int,_std::allocator<int>_> *in_stack_000000a0;
  bool in_stack_000000af;
  Transform *in_stack_000000b0;
  TriangleMesh *in_stack_000000b8;
  vector<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_> *in_stack_000000d0;
  vector<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_> *in_stack_000000d8;
  vector<int,_std::allocator<int>_> *in_stack_000000e0;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffee8;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffef0;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffff00;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffff38;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffff40;
  
  std::vector<int,_std::allocator<int>_>::vector
            (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  std::vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>::vector
            ((vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_> *)
             in_stack_ffffffffffffff40,
             (vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_> *)
             in_stack_ffffffffffffff38);
  std::vector<pbrt::Vector3<float>,_std::allocator<pbrt::Vector3<float>_>_>::vector
            ((vector<pbrt::Vector3<float>,_std::allocator<pbrt::Vector3<float>_>_> *)
             in_stack_fffffffffffffef0,
             (vector<pbrt::Vector3<float>,_std::allocator<pbrt::Vector3<float>_>_> *)
             in_stack_fffffffffffffee8);
  std::vector<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_>::vector
            ((vector<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_> *)
             in_stack_ffffffffffffff40,
             (vector<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_> *)
             in_stack_ffffffffffffff38);
  std::vector<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_>::vector
            ((vector<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_> *)
             in_stack_fffffffffffffef0,
             (vector<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_> *)
             in_stack_fffffffffffffee8);
  std::vector<int,_std::allocator<int>_>::vector
            (in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
  pbrt::TriangleMesh::TriangleMesh
            (in_stack_000000b8,in_stack_000000b0,in_stack_000000af,in_stack_000000a0,
             in_stack_00000098,in_stack_00000090,in_stack_000000d0,in_stack_000000d8,
             in_stack_000000e0);
  std::vector<int,_std::allocator<int>_>::~vector(in_stack_ffffffffffffff00);
  std::vector<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_>::~vector
            ((vector<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_> *)
             in_stack_ffffffffffffff00);
  std::vector<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_>::~vector
            ((vector<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_> *)
             in_stack_ffffffffffffff00);
  std::vector<pbrt::Vector3<float>,_std::allocator<pbrt::Vector3<float>_>_>::~vector
            ((vector<pbrt::Vector3<float>,_std::allocator<pbrt::Vector3<float>_>_> *)
             in_stack_ffffffffffffff00);
  std::vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>::~vector
            ((vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_> *)
             in_stack_ffffffffffffff00);
  std::vector<int,_std::allocator<int>_>::~vector(in_stack_ffffffffffffff00);
  return;
}

Assistant:

void construct(T *p, Args &&... args) {
        ::new ((void *)p) T(std::forward<Args>(args)...);
    }